

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O0

ssize_t __thiscall
tinyusdz::StreamReader::read(StreamReader *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  size_t nbytes;
  uint64_t len;
  uint8_t *dst_local;
  uint64_t dst_len_local;
  uint64_t n_local;
  StreamReader *this_local;
  
  nbytes = CONCAT44(in_register_00000034,__fd);
  if (this->length_ < this->idx_ + nbytes) {
    nbytes = this->length_ - this->idx_;
  }
  if (nbytes == 0) {
    this_local = (StreamReader *)0x0;
  }
  else if (__buf < nbytes) {
    this_local = (StreamReader *)0x0;
  }
  else {
    memcpy((void *)__nbytes,this->binary_ + this->idx_,nbytes);
    this->idx_ = nbytes + this->idx_;
    this_local = (StreamReader *)nbytes;
  }
  return (ssize_t)this_local;
}

Assistant:

uint64_t read(const uint64_t n, const uint64_t dst_len, uint8_t *dst) const {
    uint64_t len = n;
    if ((idx_ + len) > length_) {
      len = length_ - uint64_t(idx_);
    }

    if (len > 0) {
      if (dst_len < len) {
        // dst does not have enough space. return 0 for a while.
        return 0;
      }

      size_t nbytes = size_t(len); // may shorten size on 32bit platform

      memcpy(dst, &binary_[idx_], nbytes);
      idx_ += nbytes;
      return nbytes;

    } else {
      return 0;
    }
  }